

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_uri(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  FILE *__stream;
  int test_ret_2;
  undefined8 *puVar14;
  int n_base;
  uint uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int test_ret_7;
  int test_ret_3;
  int test_ret_4;
  uint uVar18;
  int test_ret_1;
  int test_ret;
  int local_40;
  int local_3c;
  uint local_38;
  
  if (quiet == '\0') {
    puts("Testing uri : 13 of 18 functions ...");
  }
  local_3c = 0;
  uVar18 = 0;
  do {
    puVar14 = &DAT_0015ad60;
    uVar15 = 0;
    do {
      iVar3 = xmlMemBlocks();
      if (uVar18 < 4) {
        uVar17 = (&DAT_0015ad60)[uVar18];
      }
      else {
        uVar17 = 0;
      }
      if (uVar15 < 4) {
        uVar16 = *puVar14;
      }
      else {
        uVar16 = 0;
      }
      lVar13 = xmlBuildRelativeURI(uVar17,uVar16);
      if (lVar13 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBuildRelativeURI",(ulong)(uint)(iVar4 - iVar3));
        local_3c = local_3c + 1;
        printf(" %d",(ulong)uVar18);
        printf(" %d");
        putchar(10);
      }
      uVar15 = uVar15 + 1;
      puVar14 = puVar14 + 1;
    } while (uVar15 != 5);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 5);
  function_tests = function_tests + 1;
  local_40 = 0;
  uVar18 = 0;
  do {
    puVar14 = &DAT_0015ad60;
    uVar15 = 0;
    do {
      iVar3 = xmlMemBlocks();
      if (uVar18 < 4) {
        uVar17 = (&DAT_0015ad60)[uVar18];
      }
      else {
        uVar17 = 0;
      }
      if (uVar15 < 4) {
        uVar16 = *puVar14;
      }
      else {
        uVar16 = 0;
      }
      xmlBuildRelativeURISafe(uVar17,uVar16,0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar3 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBuildRelativeURISafe",(ulong)(uint)(iVar4 - iVar3));
        local_40 = local_40 + 1;
        printf(" %d",(ulong)uVar18);
        printf(" %d");
        printf(" %d");
        putchar(10);
      }
      uVar15 = uVar15 + 1;
      puVar14 = puVar14 + 1;
    } while (uVar15 != 5);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 5);
  function_tests = function_tests + 1;
  iVar3 = 0;
  uVar18 = 0;
  do {
    puVar14 = &DAT_0015ad60;
    uVar15 = 0;
    do {
      iVar4 = xmlMemBlocks();
      if (uVar18 < 4) {
        uVar17 = (&DAT_0015ad60)[uVar18];
      }
      else {
        uVar17 = 0;
      }
      if (uVar15 < 4) {
        uVar16 = *puVar14;
      }
      else {
        uVar16 = 0;
      }
      lVar13 = xmlBuildURI(uVar17,uVar16);
      if (lVar13 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBuildURI",(ulong)(uint)(iVar5 - iVar4));
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar18);
        printf(" %d");
        putchar(10);
      }
      uVar15 = uVar15 + 1;
      puVar14 = puVar14 + 1;
    } while (uVar15 != 5);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 5);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar18 = 0;
  do {
    puVar14 = &DAT_0015ad60;
    uVar15 = 0;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar18 < 4) {
        uVar17 = (&DAT_0015ad60)[uVar18];
      }
      else {
        uVar17 = 0;
      }
      if (uVar15 < 4) {
        uVar16 = *puVar14;
      }
      else {
        uVar16 = 0;
      }
      xmlBuildURISafe(uVar17,uVar16,0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBuildURISafe",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar18);
        printf(" %d");
        printf(" %d");
        putchar(10);
      }
      uVar15 = uVar15 + 1;
      puVar14 = puVar14 + 1;
    } while (uVar15 != 5);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 5);
  local_40 = local_40 + local_3c;
  function_tests = function_tests + 1;
  puVar14 = &DAT_0015ad60;
  uVar18 = 0;
  iVar5 = 0;
  do {
    iVar6 = xmlMemBlocks();
    if (uVar18 < 4) {
      uVar17 = *puVar14;
    }
    else {
      uVar17 = 0;
    }
    lVar13 = xmlCanonicPath(uVar17);
    if (lVar13 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCanonicPath",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d",(ulong)uVar18);
      putchar(10);
    }
    uVar18 = uVar18 + 1;
    puVar14 = puVar14 + 1;
  } while (uVar18 != 5);
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  xmlNormalizeURIPath(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    iVar8 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlNormalizeURIPath",(ulong)(uint)(iVar8 - iVar6));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar14 = &DAT_0015ad48;
  uVar18 = 0;
  iVar8 = 0;
  do {
    iVar9 = xmlMemBlocks();
    if (uVar18 < 3) {
      uVar17 = *puVar14;
    }
    else {
      uVar17 = 0;
    }
    xmlParseURIReference(0,uVar17);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseURIReference",(ulong)(uint)(iVar10 - iVar9));
      iVar8 = iVar8 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar18 = uVar18 + 1;
    puVar14 = puVar14 + 1;
  } while (uVar18 != 4);
  function_tests = function_tests + 1;
  puVar14 = &DAT_0015ad80;
  local_3c = 0;
  uVar18 = 0;
  do {
    iVar9 = xmlMemBlocks();
    if (uVar18 < 7) {
      uVar17 = *puVar14;
    }
    else {
      uVar17 = 0;
    }
    xmlParseURISafe(uVar17,0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseURISafe",(ulong)(uint)(iVar10 - iVar9));
      local_3c = local_3c + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    uVar18 = uVar18 + 1;
    puVar14 = puVar14 + 1;
  } while (uVar18 != 8);
  function_tests = function_tests + 1;
  puVar14 = &DAT_0015ad60;
  uVar18 = 0;
  iVar9 = 0;
  do {
    iVar10 = xmlMemBlocks();
    if (uVar18 < 4) {
      uVar17 = *puVar14;
    }
    else {
      uVar17 = 0;
    }
    lVar13 = xmlPathToURI(uVar17);
    if (lVar13 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPathToURI",(ulong)(uint)(iVar11 - iVar10));
      iVar9 = iVar9 + 1;
      printf(" %d",(ulong)uVar18);
      putchar(10);
    }
    uVar18 = uVar18 + 1;
    puVar14 = puVar14 + 1;
  } while (uVar18 != 5);
  function_tests = function_tests + 1;
  iVar10 = 0;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    iVar11 = xmlMemBlocks();
    if (bVar1) {
      __stream = fopen64("test.out","a+");
    }
    else {
      __stream = (FILE *)0x0;
    }
    xmlPrintURI(__stream,0);
    call_tests = call_tests + 1;
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPrintURI",(ulong)(uint)(iVar12 - iVar11));
      iVar10 = iVar10 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    bVar2 = false;
  } while (bVar1);
  function_tests = function_tests + 1;
  iVar11 = xmlMemBlocks();
  lVar13 = xmlSaveUri(0);
  if (lVar13 != 0) {
    (*_xmlFree)(lVar13);
  }
  iVar4 = local_40 + iVar3 + iVar4 + iVar5 + (uint)(iVar6 != iVar7) + iVar8 + local_3c;
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar3 = xmlMemBlocks();
  if (iVar11 != iVar3) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSaveUri",(ulong)(uint)(iVar5 - iVar11));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar14 = &DAT_0015ad60;
  uVar18 = 0;
  local_3c = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (uVar18 < 4) {
      uVar17 = *puVar14;
    }
    else {
      uVar17 = 0;
    }
    lVar13 = xmlURIEscape(uVar17);
    if (lVar13 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlURIEscape",(ulong)(uint)(iVar6 - iVar5));
      local_3c = local_3c + 1;
      printf(" %d",(ulong)uVar18);
      putchar(10);
    }
    uVar18 = uVar18 + 1;
    puVar14 = puVar14 + 1;
  } while (uVar18 != 5);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar18 = 0;
  do {
    puVar14 = &DAT_0015ad60;
    uVar15 = 0;
    do {
      iVar6 = xmlMemBlocks();
      if (uVar18 < 4) {
        uVar17 = (&DAT_0015ad60)[uVar18];
      }
      else {
        uVar17 = 0;
      }
      if (uVar15 < 4) {
        uVar16 = *puVar14;
      }
      else {
        uVar16 = 0;
      }
      lVar13 = xmlURIEscapeStr(uVar17,uVar16);
      if (lVar13 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlURIEscapeStr",(ulong)(uint)(iVar7 - iVar6));
        iVar5 = iVar5 + 1;
        printf(" %d",(ulong)uVar18);
        printf(" %d");
        putchar(10);
      }
      uVar15 = uVar15 + 1;
      puVar14 = puVar14 + 1;
    } while (uVar15 != 5);
    uVar18 = uVar18 + 1;
  } while (uVar18 != 5);
  local_38 = (uint)(iVar11 != iVar3);
  function_tests = function_tests + 1;
  uVar18 = iVar4 + iVar9 + iVar10 + local_38 + local_3c + iVar5;
  if (uVar18 != 0) {
    printf("Module uri: %d errors\n",(ulong)uVar18);
  }
  return uVar18;
}

Assistant:

static int
test_uri(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing uri : 13 of 18 functions ...\n");
    test_ret += test_xmlBuildRelativeURI();
    test_ret += test_xmlBuildRelativeURISafe();
    test_ret += test_xmlBuildURI();
    test_ret += test_xmlBuildURISafe();
    test_ret += test_xmlCanonicPath();
    test_ret += test_xmlCreateURI();
    test_ret += test_xmlNormalizeURIPath();
    test_ret += test_xmlParseURI();
    test_ret += test_xmlParseURIRaw();
    test_ret += test_xmlParseURIReference();
    test_ret += test_xmlParseURISafe();
    test_ret += test_xmlPathToURI();
    test_ret += test_xmlPrintURI();
    test_ret += test_xmlSaveUri();
    test_ret += test_xmlURIEscape();
    test_ret += test_xmlURIEscapeStr();
    test_ret += test_xmlURIUnescapeString();

    if (test_ret != 0)
	printf("Module uri: %d errors\n", test_ret);
    return(test_ret);
}